

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateDeclarations
          (ServiceGenerator *this,Printer *printer)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  char acVar1 [8];
  Sub *local_290;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  undefined1 local_241;
  anon_class_16_2_bb68eac7_for_cb local_240;
  allocator<char> local_229;
  string local_228;
  anon_class_16_2_bb68eac7_for_cb local_208 [2];
  allocator<char> local_1e1;
  string local_1e0;
  Sub *local_1c0;
  Sub local_1b8;
  Sub local_100;
  iterator local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38;
  undefined1 local_28 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1025:28)>
  vars;
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  vars.storage_.callback_buffer_ = (char  [8])printer;
  io::Printer::
  WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1025:28)>
              *)local_28,printer,&this->vars_);
  acVar1 = vars.storage_.callback_buffer_;
  local_241 = 1;
  local_1c0 = &local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"virts",&local_1e1);
  local_208[0].printer = (Printer **)vars.storage_.callback_buffer_;
  local_208[0].this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::ServiceGenerator::GenerateDeclarations(google::protobuf::io::Printer*)::__0>
            (&local_1b8,&local_1e0,local_208);
  local_1c0 = &local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"impls",&local_229);
  local_240.printer = (Printer **)vars.storage_.callback_buffer_;
  local_240.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::ServiceGenerator::GenerateDeclarations(google::protobuf::io::Printer*)::__1>
            (&local_100,&local_228,&local_240);
  local_241 = 0;
  local_48 = &local_1b8;
  local_40 = 2;
  v._M_len = 2;
  v._M_array = local_48;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_38._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_258,
             "\n        class $classname$_Stub;\n        class $dllexport_decl $$classname$ : public $pb$::Service {\n         protected:\n          $classname$() = default;\n\n         public:\n          using Stub = $classname$_Stub;\n\n          $classname$(const $classname$&) = delete;\n          $classname$& operator=(const $classname$&) = delete;\n          virtual ~$classname$() = default;\n\n          static const $pb$::ServiceDescriptor* $nonnull$ descriptor();\n\n          $virts$;\n\n          // implements Service ----------------------------------------------\n          const $pb$::ServiceDescriptor* $nonnull$ GetDescriptor() override;\n\n          void CallMethod(\n              //~\n              const $pb$::MethodDescriptor* $nonnull$ method,\n              $pb$::RpcController* $nullable$ controller,\n              const $pb$::Message* $nonnull$ request,\n              $pb$::Message* $nonnull$ response,\n              ::google::protobuf::Closure* $nullable$ done) override;\n\n          const $pb$::Message& GetRequestPrototype(\n              const $pb$::MethodDescriptor* $nonnull$ method) const override;\n\n          const $pb$::Message& GetResponsePrototype(\n              const $pb$::MethodDescriptor* $nonnull$ method) const override;\n        };\n\n        class $dllexport_decl $$classname$_Stub final : public $classname$ {\n         public:\n          //~ It seems like channel should be nonnull, but some tests use\n          //~ nullptr. TODO: clean up and switch to nonnull.\n          $classname$_Stub($pb$::RpcChannel* $nullable$ channel);\n          $classname$_Stub($pb$::RpcChannel* $nullable$ channel,\n                           $pb$::Service::ChannelOwnership ownership);\n\n          $classname$_Stub(const $classname$_Stub&) = delete;\n          $classname$_Stub& operator=(const $classname$_Stub&) = delete;\n\n          ~$classname$_Stub() override;\n\n          inline $pb$::RpcChannel* $nullable$ channel() { return channel_; }\n\n          // implements $classname$ ------------------------------------------\n          $impls$;\n\n         private:\n     ..." /* TRUNCATED STRING LITERAL */
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)acVar1,local_38._M_allocated_capacity,local_38._8_8_,local_258._M_len
                    ,local_258._M_str);
  local_290 = (Sub *)&local_48;
  do {
    local_290 = local_290 + -1;
    io::Printer::Sub::~Sub(local_290);
  } while (local_290 != &local_1b8);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1025:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1025:28)>
              *)local_28);
  return;
}

Assistant:

void ServiceGenerator::GenerateDeclarations(io::Printer* printer) {
  auto vars = printer->WithVars(&vars_);
  printer->Emit(
      {
          {"virts", [&] { GenerateMethodSignatures(kVirtual, printer); }},
          {"impls", [&] { GenerateMethodSignatures(kNonVirtual, printer); }},
      },
      R"cc(
        class $classname$_Stub;
        class $dllexport_decl $$classname$ : public $pb$::Service {
         protected:
          $classname$() = default;

         public:
          using Stub = $classname$_Stub;

          $classname$(const $classname$&) = delete;
          $classname$& operator=(const $classname$&) = delete;
          virtual ~$classname$() = default;

          static const $pb$::ServiceDescriptor* $nonnull$ descriptor();

          $virts$;

          // implements Service ----------------------------------------------
          const $pb$::ServiceDescriptor* $nonnull$ GetDescriptor() override;

          void CallMethod(
              //~
              const $pb$::MethodDescriptor* $nonnull$ method,
              $pb$::RpcController* $nullable$ controller,
              const $pb$::Message* $nonnull$ request,
              $pb$::Message* $nonnull$ response,
              ::google::protobuf::Closure* $nullable$ done) override;

          const $pb$::Message& GetRequestPrototype(
              const $pb$::MethodDescriptor* $nonnull$ method) const override;

          const $pb$::Message& GetResponsePrototype(
              const $pb$::MethodDescriptor* $nonnull$ method) const override;
        };

        class $dllexport_decl $$classname$_Stub final : public $classname$ {
         public:
          //~ It seems like channel should be nonnull, but some tests use
          //~ nullptr. TODO: clean up and switch to nonnull.
          $classname$_Stub($pb$::RpcChannel* $nullable$ channel);
          $classname$_Stub($pb$::RpcChannel* $nullable$ channel,
                           $pb$::Service::ChannelOwnership ownership);

          $classname$_Stub(const $classname$_Stub&) = delete;
          $classname$_Stub& operator=(const $classname$_Stub&) = delete;

          ~$classname$_Stub() override;

          inline $pb$::RpcChannel* $nullable$ channel() { return channel_; }

          // implements $classname$ ------------------------------------------
          $impls$;

         private:
          $pb$::RpcChannel* $nullable$ channel_;
          bool owns_channel_;
        };
      )cc");
}